

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O2

QVariant * __thiscall QJsonDocument::toVariant(QVariant *__return_storage_ptr__,QJsonDocument *this)

{
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> _Var1;
  QCborContainerPrivate *object;
  long in_FS_OFFSET;
  QJsonArray QStack_38;
  QArrayDataPointer<QVariant> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (this->d)._M_t.
       super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
       super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (QJsonDocumentPrivate *)0x0) {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    object = *(QCborContainerPrivate **)((long)&(_Var1._M_head_impl)->value + 8);
    if (*(Type *)((long)&(_Var1._M_head_impl)->value + 0x10) == Array) {
      QJsonArray::QJsonArray(&QStack_38,object);
      QJsonArray::toVariantList((QVariantList *)&local_30,&QStack_38);
      ::QVariant::QVariant(__return_storage_ptr__,(QList<QVariant> *)&local_30);
      QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_30);
      QJsonArray::~QJsonArray(&QStack_38);
    }
    else {
      QJsonObject::QJsonObject((QJsonObject *)&QStack_38,object);
      QJsonObject::toVariantMap((QJsonObject *)&local_30);
      ::QVariant::QVariant(__return_storage_ptr__,(QMap<QString,_QVariant> *)&local_30);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                  *)&local_30);
      QJsonObject::~QJsonObject((QJsonObject *)&QStack_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QJsonDocument::toVariant() const
{
    if (!d)
        return QVariant();

    QCborContainerPrivate *container = QJsonPrivate::Value::container(d->value);
    if (d->value.isArray())
        return QJsonArray(container).toVariantList();
    return QJsonObject(container).toVariantMap();
}